

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O0

void __thiscall
Diligent::DescriptorPoolManager::DescriptorPoolManager
          (DescriptorPoolManager *this,RenderDeviceVkImpl *DeviceVkImpl,string *PoolName,
          vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *PoolSizes,
          uint32_t MaxSets,bool AllowFreeing)

{
  bool AllowFreeing_local;
  uint32_t MaxSets_local;
  vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *PoolSizes_local;
  string *PoolName_local;
  RenderDeviceVkImpl *DeviceVkImpl_local;
  DescriptorPoolManager *this_local;
  
  this->m_DeviceVkImpl = DeviceVkImpl;
  std::__cxx11::string::string((string *)&this->m_PoolName,(string *)PoolName);
  PrunePoolSizes(&this->m_PoolSizes,DeviceVkImpl,PoolSizes);
  this->m_MaxSets = MaxSets;
  this->m_AllowFreeing = AllowFreeing;
  std::mutex::mutex(&this->m_Mutex);
  std::
  deque<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
  ::deque(&this->m_Pools);
  std::__atomic_base<int>::operator=(&(this->m_AllocatedPoolCounter).super___atomic_base<int>,0);
  return;
}

Assistant:

DescriptorPoolManager::DescriptorPoolManager(RenderDeviceVkImpl&               DeviceVkImpl,
                                             std::string                       PoolName,
                                             std::vector<VkDescriptorPoolSize> PoolSizes,
                                             uint32_t                          MaxSets,
                                             bool                              AllowFreeing) noexcept :
    // clang-format off
    m_DeviceVkImpl{DeviceVkImpl        },
    m_PoolName    {std::move(PoolName) },
    m_PoolSizes   (PrunePoolSizes(DeviceVkImpl, std::move(PoolSizes))),
    m_MaxSets     {MaxSets             },
    m_AllowFreeing{AllowFreeing        }
// clang-format on
{
#ifdef DILIGENT_DEVELOPMENT
    m_AllocatedPoolCounter = 0;
#endif
}